

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O1

void tommy_trie_inplace_insert
               (tommy_trie_inplace *trie_inplace,tommy_trie_inplace_node *node,void *data,
               tommy_key_t key)

{
  long lVar1;
  tommy_trie_inplace_node *ptVar2;
  tommy_trie_inplace_node_struct *ptVar3;
  byte bVar4;
  uint uVar5;
  tommy_trie_inplace_node *ptVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node->data = data;
  node->key = key;
  node->map[0] = (tommy_trie_inplace_node_struct *)0x0;
  node->map[1] = (tommy_trie_inplace_node_struct *)0x0;
  node->map[2] = (tommy_trie_inplace_node_struct *)0x0;
  node->map[3] = (tommy_trie_inplace_node_struct *)0x0;
  if (trie_inplace->bucket[key >> 0x1a] == (tommy_trie_inplace_node *)0x0) {
    ptVar3 = (tommy_trie_inplace_node_struct *)(trie_inplace->bucket + (key >> 0x1a));
  }
  else {
    bVar4 = 0x1a;
    ptVar2 = trie_inplace->bucket[key >> 0x1a];
    do {
      ptVar6 = ptVar2;
      if (ptVar6->key == key) {
        node->prev = ptVar6->prev;
        ptVar6->prev = node;
        node->next = (tommy_trie_inplace_node_struct *)0x0;
        ptVar3 = node->prev;
        goto LAB_0010fcd5;
      }
      uVar5 = key >> (bVar4 & 0x1f) & 3;
      bVar4 = bVar4 - 2;
      ptVar2 = ptVar6->map[uVar5];
    } while (ptVar6->map[uVar5] != (tommy_trie_inplace_node_struct *)0x0);
    ptVar3 = (tommy_trie_inplace_node_struct *)(ptVar6->map + uVar5);
  }
  node->prev = node;
  node->next = (tommy_trie_inplace_node_struct *)0x0;
LAB_0010fcd5:
  ptVar3->next = node;
  trie_inplace->count = trie_inplace->count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_trie_inplace_insert(tommy_trie_inplace* trie_inplace, tommy_trie_inplace_node* node, void* data, tommy_key_t key)
{
	tommy_trie_inplace_node** let_ptr;
	tommy_uint_t i;

	node->data = data;
	node->key = key;
	/* clear the child pointers */
	for (i = 0; i < TOMMY_TRIE_INPLACE_TREE_MAX; ++i)
		node->map[i] = 0;

	let_ptr = &trie_inplace->bucket[key >> TOMMY_TRIE_INPLACE_BUCKET_SHIFT];

	trie_inplace_bucket_insert(TOMMY_TRIE_INPLACE_BUCKET_SHIFT, let_ptr, node, key);

	++trie_inplace->count;
}